

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O3

void __thiscall
spdlog::logger::set_pattern(logger *this,string *pattern,pattern_time_type time_type)

{
  pointer *__ptr;
  _Alloc_hider local_28;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_20 [2];
  
  local_20[1]._M_head_impl._4_4_ = time_type;
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string,spdlog::pattern_time_type&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (pattern_time_type *)pattern);
  local_20[0]._M_head_impl = (formatter *)local_28._M_p;
  local_28._M_p = (pointer)0x0;
  set_formatter(this,(unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                     local_20);
  if (local_20[0]._M_head_impl != (formatter *)0x0) {
    (*(local_20[0]._M_head_impl)->_vptr_formatter[1])();
  }
  if ((pattern_formatter *)local_28._M_p != (pattern_formatter *)0x0) {
    std::default_delete<spdlog::pattern_formatter>::operator()
              ((default_delete<spdlog::pattern_formatter> *)&local_28,
               (pattern_formatter *)local_28._M_p);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_pattern(std::string pattern, pattern_time_type time_type)
{
    auto new_formatter = details::make_unique<pattern_formatter>(std::move(pattern), time_type);
    set_formatter(std::move(new_formatter));
}